

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<CylHead&,char_const(&)[46]>
          (exception *this,CylHead *args,char (*args_1) [46])

{
  char (*in_RCX) [46];
  string local_40;
  char (*local_20) [46];
  char (*args_local_1) [46];
  CylHead *args_local;
  exception *this_local;
  
  local_20 = args_1;
  args_local_1 = (char (*) [46])args;
  args_local = (CylHead *)this;
  make_string<CylHead&,char_const(&)[46]>(&local_40,(util *)args,(CylHead *)args_1,in_RCX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}